

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

QDockWidget * __thiscall
QDockWidgetGroupWindow::activeTabbedDockWidget(QDockWidgetGroupWindow *this)

{
  QLayoutItem *pQVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  QDockAreaLayoutInfo *this_00;
  QDockWidget *pQVar5;
  ulong uVar6;
  long lVar7;
  QDockAreaLayoutItem *this_01;
  
  this_00 = tabLayoutInfo(this);
  if (this_00 == (QDockAreaLayoutInfo *)0x0) {
LAB_0042d2a9:
    pQVar5 = (QDockWidget *)0x0;
  }
  else {
    if ((this_00->tabBar != (QTabBar *)0x0) &&
       (iVar3 = QTabBar::currentIndex(this_00->tabBar), -1 < iVar3)) {
      iVar3 = QTabBar::currentIndex(this_00->tabBar);
      uVar4 = QDockAreaLayoutInfo::tabIndexToListIndex(this_00,iVar3);
      if ((-1 < (int)uVar4) &&
         (pQVar1 = (this_00->item_list).d.ptr[uVar4].widgetItem, pQVar1 != (QLayoutItem *)0x0)) {
        (*pQVar1->_vptr_QLayoutItem[0xd])();
        pQVar5 = (QDockWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
        if (pQVar5 != (QDockWidget *)0x0) {
          return pQVar5;
        }
      }
    }
    uVar6 = 0xffffffffffffffff;
    lVar7 = 0;
    do {
      uVar6 = uVar6 + 1;
      if ((ulong)(this_00->item_list).d.size <= uVar6) goto LAB_0042d2a9;
      this_01 = (QDockAreaLayoutItem *)((long)&((this_00->item_list).d.ptr)->widgetItem + lVar7);
      bVar2 = QDockAreaLayoutItem::skip(this_01);
      if ((bVar2) || (pQVar1 = this_01->widgetItem, pQVar1 == (QLayoutItem *)0x0)) {
        pQVar5 = (QDockWidget *)0x0;
      }
      else {
        (*pQVar1->_vptr_QLayoutItem[0xd])();
        pQVar5 = (QDockWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
      }
      lVar7 = lVar7 + 0x28;
    } while (pQVar5 == (QDockWidget *)0x0);
  }
  return pQVar5;
}

Assistant:

QDockWidget *QDockWidgetGroupWindow::activeTabbedDockWidget() const
{
    QDockWidget *dw = nullptr;
    const QDockAreaLayoutInfo *info = tabLayoutInfo();
    if (!info)
        return nullptr;
    if (info->tabBar && info->tabBar->currentIndex() >= 0) {
        int i = info->tabIndexToListIndex(info->tabBar->currentIndex());
        if (i >= 0) {
            const QDockAreaLayoutItem &item = info->item_list.at(i);
            if (item.widgetItem)
                dw = qobject_cast<QDockWidget *>(item.widgetItem->widget());
        }
    }
    if (!dw) {
        for (int i = 0; !dw && i < info->item_list.size(); ++i) {
            const QDockAreaLayoutItem &item = info->item_list.at(i);
            if (item.skip())
                continue;
            if (!item.widgetItem)
                continue;
            dw = qobject_cast<QDockWidget *>(item.widgetItem->widget());
        }
    }
    return dw;
}